

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::TrackEventCategory::Serialize(TrackEventCategory *this,Message *msg)

{
  pointer pbVar1;
  uint8_t *src_begin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it;
  pointer pbVar2;
  
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 2) != 0) {
    protozero::Message::AppendBytes
              (msg,1,(this->name_)._M_dataplus._M_p,(this->name_)._M_string_length);
  }
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 4) != 0) {
    protozero::Message::AppendBytes
              (msg,2,(this->description_)._M_dataplus._M_p,(this->description_)._M_string_length);
  }
  pbVar1 = (this->tags_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar2 = (this->tags_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    protozero::Message::AppendBytes(msg,3,(pbVar2->_M_dataplus)._M_p,pbVar2->_M_string_length);
  }
  src_begin = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  protozero::Message::WriteToStream
            (msg,src_begin,src_begin + (this->unknown_fields_)._M_string_length);
  return;
}

Assistant:

void TrackEventCategory::Serialize(::protozero::Message* msg) const {
  // Field 1: name
  if (_has_field_[1]) {
    msg->AppendString(1, name_);
  }

  // Field 2: description
  if (_has_field_[2]) {
    msg->AppendString(2, description_);
  }

  // Field 3: tags
  for (auto& it : tags_) {
    msg->AppendString(3, it);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}